

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

int steedintrap(trap *trap,obj *otmp)

{
  permonst *ppVar1;
  byte bVar2;
  bool bVar3;
  monst *mon;
  byte bVar4;
  boolean bVar5;
  int iVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  boolean steedhit;
  boolean trapkilled;
  boolean in_sight;
  int tt;
  permonst *mptr;
  monst *mtmp;
  obj *otmp_local;
  trap *trap_local;
  
  mon = u.usteed;
  bVar9 = false;
  bVar3 = false;
  if ((u.usteed == (monst *)0x0) || (trap == (trap *)0x0)) {
    return 0;
  }
  ppVar1 = (u.usteed)->data;
  bVar4 = trap->field_0x8 & 0x1f;
  (u.usteed)->mx = u.ux;
  mon->my = u.uy;
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (bVar2 = 0, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    bVar8 = false;
    if (ublindf != (obj *)0x0) {
      bVar8 = ublindf->oartifact == '\x1d';
    }
    bVar2 = bVar8 ^ 1;
  }
  switch(bVar4) {
  case 1:
    if (otmp == (obj *)0x0) {
      impossible("steed hit by non-existant arrow?");
      return 0;
    }
    bVar5 = thitm(8,mon,otmp,0,'\0');
    bVar9 = bVar5 != '\0';
    bVar3 = true;
    break;
  case 2:
  case 0x18:
    if (otmp == (obj *)0x0) {
      pcVar7 = "dart";
      if (bVar4 == 0x18) {
        pcVar7 = "shuriken";
      }
      impossible("steed hit by non-existant %s?",pcVar7);
      return 0;
    }
    bVar5 = thitm(7,mon,otmp,0,'\0');
    bVar9 = bVar5 != '\0';
    bVar3 = true;
    break;
  default:
    return 0;
  case 6:
    iVar6 = rnd(0x10);
    bVar5 = thitm(0,mon,(obj *)0x0,iVar6,'\0');
    bVar9 = bVar5 != '\0';
    bVar3 = true;
    break;
  case 8:
    if ((((mon->mintrinsics & 4) == 0) && ((ppVar1->mflags1 & 0x400) == 0)) &&
       (((*(uint *)&mon->field_0x60 >> 0x13 & 1) == 0 &&
        ((*(uint *)&mon->field_0x60 >> 0x12 & 1) != 0)))) {
      *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xfffbffff;
      iVar6 = rnd(0x19);
      mon->mfrozen = (uchar)iVar6;
      if ((bool)(~bVar2 & 1)) {
        pcVar7 = Monnam(mon);
        pline("%s suddenly falls asleep!",pcVar7);
      }
    }
    bVar3 = true;
    break;
  case 0xb:
  case 0xc:
    if (mon->mhp < 1) {
LAB_0030a084:
      bVar9 = true;
    }
    else {
      iVar6 = 10;
      if (bVar4 == 0xb) {
        iVar6 = 6;
      }
      iVar6 = rnd(iVar6);
      bVar5 = thitm(0,mon,(obj *)0x0,iVar6,'\0');
      if (bVar5 != '\0') goto LAB_0030a084;
    }
    bVar3 = true;
    break;
  case 0x17:
    bVar5 = resists_magm(mon);
    if (bVar5 == '\0') {
      iVar6 = resist(mon,'\v',0,0);
      if (iVar6 == 0) {
        newcham(level,mon,(permonst *)0x0,'\0','\0');
        bVar5 = can_saddle(mon);
        if ((bVar5 == '\0') || (bVar5 = can_ride(mon), bVar5 == '\0')) {
          dismount_steed(3);
        }
        else {
          iVar6 = 2;
          if (mon->mnamelth != '\0') {
            iVar6 = 0;
          }
          pcVar7 = x_monnam(mon,iVar6,(char *)0x0,8,'\0');
          pline("You have to adjust yourself in the saddle on %s.",pcVar7);
        }
      }
      bVar3 = true;
    }
  }
  if (bVar9) {
    dismount_steed(3);
    trap_local._4_4_ = 2;
  }
  else if (bVar3) {
    trap_local._4_4_ = 1;
  }
  else {
    trap_local._4_4_ = 0;
  }
  return trap_local._4_4_;
}

Assistant:

static int steedintrap(struct trap *trap, struct obj *otmp)
{
	struct monst *mtmp = u.usteed;
	const struct permonst *mptr;
	int tt;
	boolean in_sight;
	boolean trapkilled = FALSE;
	boolean steedhit = FALSE;

	if (!u.usteed || !trap) return 0;
	mptr = mtmp->data;
	tt = trap->ttyp;
	mtmp->mx = u.ux;
	mtmp->my = u.uy;

	in_sight = !Blind;
	switch (tt) {
		case ARROW_TRAP:
			if (!otmp) {
				impossible("steed hit by non-existant arrow?");
				return 0;
			}
			if (thitm(8, mtmp, otmp, 0, FALSE)) trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case DART_TRAP:
		case SHURIKEN_TRAP:
			if (!otmp) {
				impossible("steed hit by non-existant %s?",
					   tt == SHURIKEN_TRAP ? "shuriken" : "dart");
				return 0;
			}
			if (thitm(7, mtmp, otmp, 0, FALSE)) trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case SLP_GAS_TRAP:
		    if (!resists_sleep(mtmp) && !breathless(mptr) &&
				!mtmp->msleeping && mtmp->mcanmove) {
			    mtmp->mcanmove = 0;
			    mtmp->mfrozen = rnd(25);
			    if (in_sight) {
				pline("%s suddenly falls asleep!",
				      Monnam(mtmp));
			    }
			}
			steedhit = TRUE;
			break;
		case LANDMINE:
			if (thitm(0, mtmp, NULL, rnd(16), FALSE))
			    trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case PIT:
		case SPIKED_PIT:
			if (mtmp->mhp <= 0 ||
				thitm(0, mtmp, NULL,
				      rnd((tt == PIT) ? 6 : 10), FALSE))
			    trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case POLY_TRAP: 
		    if (!resists_magm(mtmp)) {
			if (!resist(mtmp, WAND_CLASS, 0, NOTELL)) {
				newcham(level, mtmp, NULL,
					       FALSE, FALSE);
			if (!can_saddle(mtmp) || !can_ride(mtmp)) {
				dismount_steed(DISMOUNT_POLY);
			} else {
				pline("You have to adjust yourself in the saddle on %s.",
					x_monnam(mtmp,
					 mtmp->mnamelth ? ARTICLE_NONE : ARTICLE_A,
				 	 NULL, SUPPRESS_SADDLE, FALSE));
			}
				
		    }
		    steedhit = TRUE;
		    break;
		default:
			return 0;
	    }
	}
	if (trapkilled) {
		dismount_steed(DISMOUNT_POLY);
		return 2;
	}
	else if (steedhit) return 1;
	else return 0;
}